

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tourmng.cpp
# Opt level: O3

string * banksia::TourMng::createLogPath
                   (string *__return_storage_ptr__,string *opath,bool onefile,bool usesurfix,
                   bool includeGameResult,Game *game,Side forSide)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint __val;
  Game *this;
  string *this_00;
  string *psVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  Player *pPVar7;
  undefined8 *puVar8;
  long lVar9;
  undefined1 shortFrom;
  uint uVar10;
  long *plVar11;
  undefined8 *puVar12;
  ulong *puVar13;
  ulong uVar14;
  uint uVar15;
  undefined8 uVar16;
  undefined7 in_register_00000081;
  char *pcVar17;
  uint __len;
  string s;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  string local_d0;
  undefined4 local_ac;
  Game *local_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  string *local_80;
  string *local_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (game == (Game *)0x0 || onefile) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (opath->_M_dataplus)._M_p;
    paVar1 = &opath->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar16 = *(undefined8 *)((long)&opath->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar16;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = opath->_M_string_length;
    (opath->_M_dataplus)._M_p = (pointer)paVar1;
    opath->_M_string_length = 0;
    (opath->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  local_ac = (undefined4)CONCAT71(in_register_00000081,includeGameResult);
  pcVar17 = "-";
  if (usesurfix) {
    pcVar17 = ", ";
  }
  local_80 = opath;
  local_78 = __return_storage_ptr__;
  iVar5 = Game::getIdx(game);
  uVar15 = iVar5 + 1;
  __val = -uVar15;
  if (0 < (int)uVar15) {
    __val = uVar15;
  }
  __len = 1;
  if (9 < __val) {
    uVar14 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar10 = (uint)uVar14;
      if (uVar10 < 100) {
        __len = __len - 2;
        goto LAB_0015f7b1;
      }
      if (uVar10 < 1000) {
        __len = __len - 1;
        goto LAB_0015f7b1;
      }
      if (uVar10 < 10000) goto LAB_0015f7b1;
      uVar14 = uVar14 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar10);
    __len = __len + 1;
  }
LAB_0015f7b1:
  local_f0 = &local_e0;
  local_a8 = game;
  std::__cxx11::string::_M_construct((ulong)&local_f0,(char)__len - (char)((int)uVar15 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar15 >> 0x1f) + (long)local_f0),__len,__val);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)pcVar17);
  psVar3 = local_78;
  this_00 = local_80;
  this = local_a8;
  plVar11 = plVar6 + 2;
  if ((long *)*plVar6 == plVar11) {
    local_90 = *plVar11;
    lStack_88 = plVar6[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar11;
    local_a0 = (long *)*plVar6;
  }
  local_98 = plVar6[1];
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  shortFrom = SUB81(plVar11,0);
  if (usesurfix) {
    pPVar7 = Game::getPlayer(this,white);
    if ((pPVar7 == (Player *)0x0) || (pPVar7 = Game::getPlayer(this,black), pPVar7 == (Player *)0x0)
       ) {
      (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)psVar3,"");
      goto LAB_0015fc22;
    }
    Game::getGameTitleString_abi_cxx11_(&local_d0,this,local_ac._0_1_);
    puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x1894d0);
    puVar12 = puVar8 + 2;
    if ((undefined8 *)*puVar8 == puVar12) {
      local_e0 = *puVar12;
      uStack_d8 = puVar8[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar12;
      local_f0 = (undefined8 *)*puVar8;
    }
    local_e8 = puVar8[1];
    *puVar8 = puVar12;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_f0);
    shortFrom = SUB81(puVar12,0);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  if (forSide != none) {
    side2String_abi_cxx11_(&local_d0,(banksia *)(ulong)forSide,white,(bool)shortFrom);
    puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x18797b);
    puVar12 = puVar8 + 2;
    if ((undefined8 *)*puVar8 == puVar12) {
      local_e0 = *puVar12;
      uStack_d8 = puVar8[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar12;
      local_f0 = (undefined8 *)*puVar8;
    }
    local_e8 = puVar8[1];
    *puVar8 = puVar12;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_f0);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  lVar9 = std::__cxx11::string::rfind((char *)this_00,0x187020,0xffffffffffffffff);
  if (lVar9 == -1) {
    std::__cxx11::string::_M_append((char *)this_00,(ulong)local_a0);
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)this_00);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_50,(ulong)local_a0);
    paVar1 = &local_d0.field_2;
    puVar13 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_d0.field_2._M_allocated_capacity = *puVar13;
      local_d0.field_2._8_8_ = plVar6[3];
      local_d0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *puVar13;
      local_d0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_d0._M_string_length = plVar6[1];
    *plVar6 = (long)puVar13;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::substr((ulong)&local_70,(ulong)this_00);
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      uVar16 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_68 + local_d0._M_string_length) {
      uVar14 = 0xf;
      if (local_70 != local_60) {
        uVar14 = local_60[0];
      }
      if (uVar14 < local_68 + local_d0._M_string_length) goto LAB_0015fb25;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_70,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
    }
    else {
LAB_0015fb25:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_70);
    }
    puVar12 = puVar8 + 2;
    if ((undefined8 *)*puVar8 == puVar12) {
      local_e0 = *puVar12;
      uStack_d8 = puVar8[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar12;
      local_f0 = (undefined8 *)*puVar8;
    }
    local_e8 = puVar8[1];
    *puVar8 = puVar12;
    puVar8[1] = 0;
    *(undefined1 *)puVar12 = 0;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_f0);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
  pcVar2 = (this_00->_M_dataplus)._M_p;
  paVar1 = &this_00->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar16 = *(undefined8 *)((long)&this_00->field_2 + 8);
    (psVar3->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&psVar3->field_2 + 8) = uVar16;
  }
  else {
    (psVar3->_M_dataplus)._M_p = pcVar2;
    (psVar3->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  psVar3->_M_string_length = this_00->_M_string_length;
  (this_00->_M_dataplus)._M_p = (pointer)paVar1;
  this_00->_M_string_length = 0;
  (this_00->field_2)._M_local_buf[0] = '\0';
LAB_0015fc22:
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  return psVar3;
}

Assistant:

std::string TourMng::createLogPath(std::string opath, bool onefile, bool usesurfix, bool includeGameResult, const Game* game, Side forSide)
{
    if (onefile || game == nullptr) return opath;
    
    std::string s = (usesurfix ? ", " : "-") + std::to_string(game->getIdx() + 1);
    if (usesurfix) {
        if (!game->getPlayer(Side::white) || !game->getPlayer(Side::black)) {
            return "";
        }
        s += ") " + game->getGameTitleString(includeGameResult);
    }
    
    if (forSide != Side::none) {
        s += ", " + side2String(forSide, true);
    }
    
    auto p = opath.rfind(".");
    if (p == std::string::npos) {
        opath += s;
    } else {
        opath = opath.substr(0, p) + s + opath.substr(p);
    }
    return opath;
}